

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O1

void Diligent::GLSLangUtils::anon_unknown_3::SetupWithSpirvVersion
               (TShader *Shader,EProfile *shProfile,EShLanguage ShLang,SpirvVersion Version,
               EShSource ShSource)

{
  EShTargetClientVersion EVar1;
  EShTargetLanguageVersion EVar2;
  string msg;
  string local_28;
  
  *shProfile = ENoProfile;
  switch(Version) {
  case Vk100:
    (Shader->environment).input.languageFamily = ShSource;
    (Shader->environment).input.stage = ShLang;
    (Shader->environment).input.dialect = EShClientVulkan;
    (Shader->environment).input.dialectVersion = 100;
    EVar1 = EShTargetVulkan_1_0;
    EVar2 = EShTargetSpv_1_0;
    break;
  case Vk110:
    (Shader->environment).input.languageFamily = ShSource;
    (Shader->environment).input.stage = ShLang;
    (Shader->environment).input.dialect = EShClientVulkan;
    (Shader->environment).input.dialectVersion = 0x6e;
    EVar1 = EShTargetVulkan_1_1;
    EVar2 = EShTargetSpv_1_3;
    break;
  case Vk110_Spirv14:
    (Shader->environment).input.languageFamily = ShSource;
    (Shader->environment).input.stage = ShLang;
    (Shader->environment).input.dialect = EShClientVulkan;
    (Shader->environment).input.dialectVersion = 0x6e;
    EVar1 = EShTargetVulkan_1_1;
    EVar2 = EShTargetSpv_1_4;
    break;
  case Vk120:
    (Shader->environment).input.languageFamily = ShSource;
    (Shader->environment).input.stage = ShLang;
    (Shader->environment).input.dialect = EShClientVulkan;
    (Shader->environment).input.dialectVersion = 0x78;
    EVar1 = EShTargetVulkan_1_2;
    EVar2 = EShTargetSpv_1_5;
    break;
  case GL:
    (Shader->environment).input.languageFamily = ShSource;
    (Shader->environment).input.stage = ShLang;
    (Shader->environment).input.dialect = EShClientOpenGL;
    (Shader->environment).input.dialectVersion = 0x1c2;
    (Shader->environment).client.client = EShClientOpenGL;
    (Shader->environment).client.version = EShTargetOpenGL_450;
    (Shader->environment).target.language = EShTargetSpv;
    (Shader->environment).target.version = EShTargetSpv_1_0;
    *shProfile = ECoreProfile;
    return;
  case GLES:
    (Shader->environment).input.languageFamily = ShSource;
    (Shader->environment).input.stage = ShLang;
    (Shader->environment).input.dialect = EShClientOpenGL;
    (Shader->environment).input.dialectVersion = 0x1c2;
    (Shader->environment).client.client = EShClientOpenGL;
    (Shader->environment).client.version = EShTargetOpenGL_450;
    (Shader->environment).target.language = EShTargetSpv;
    (Shader->environment).target.version = EShTargetSpv_1_0;
    *shProfile = EEsProfile;
    return;
  default:
    FormatString<char[22]>(&local_28,(char (*) [22])"Unknown SPIRV version");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"SetupWithSpirvVersion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x192);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p == &local_28.field_2) {
      return;
    }
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    return;
  }
  (Shader->environment).client.client = EShClientVulkan;
  (Shader->environment).client.version = EVar1;
  (Shader->environment).target.language = EShTargetSpv;
  (Shader->environment).target.version = EVar2;
  return;
}

Assistant:

void SetupWithSpirvVersion(::glslang::TShader&  Shader,
                           ::EProfile&          shProfile,
                           EShLanguage          ShLang,
                           SpirvVersion         Version,
                           ::glslang::EShSource ShSource)
{
    static_assert(static_cast<int>(SpirvVersion::Count) == 6, "Did you add a new member to SpirvVersion? You may need to handle it here.");

    shProfile = EProfile::ENoProfile;
    switch (Version)
    {
        case SpirvVersion::Vk100:
            Shader.setEnvInput(ShSource, ShLang, ::glslang::EShClientVulkan, 100);
            Shader.setEnvClient(::glslang::EShClientVulkan, ::glslang::EShTargetVulkan_1_0);
            Shader.setEnvTarget(::glslang::EShTargetSpv, ::glslang::EShTargetSpv_1_0);
            break;
        case SpirvVersion::Vk110:
            Shader.setEnvInput(ShSource, ShLang, ::glslang::EShClientVulkan, 110);
            Shader.setEnvClient(::glslang::EShClientVulkan, ::glslang::EShTargetVulkan_1_1);
            Shader.setEnvTarget(::glslang::EShTargetSpv, ::glslang::EShTargetSpv_1_3);
            break;
        case SpirvVersion::Vk110_Spirv14:
            Shader.setEnvInput(ShSource, ShLang, ::glslang::EShClientVulkan, 110);
            Shader.setEnvClient(::glslang::EShClientVulkan, ::glslang::EShTargetVulkan_1_1);
            Shader.setEnvTarget(::glslang::EShTargetSpv, ::glslang::EShTargetSpv_1_4);
            break;
        case SpirvVersion::Vk120:
            Shader.setEnvInput(ShSource, ShLang, ::glslang::EShClientVulkan, 120);
            Shader.setEnvClient(::glslang::EShClientVulkan, ::glslang::EShTargetVulkan_1_2);
            Shader.setEnvTarget(::glslang::EShTargetSpv, ::glslang::EShTargetSpv_1_5);
            break;

        case SpirvVersion::GL:
            Shader.setEnvInput(ShSource, ShLang, ::glslang::EShClientOpenGL, 450);
            Shader.setEnvClient(::glslang::EShClientOpenGL, ::glslang::EShTargetOpenGL_450);
            Shader.setEnvTarget(::glslang::EShTargetSpv, ::glslang::EShTargetSpv_1_0);
            shProfile = EProfile::ECoreProfile;
            break;
        case SpirvVersion::GLES:
            Shader.setEnvInput(ShSource, ShLang, ::glslang::EShClientOpenGL, 450);
            Shader.setEnvClient(::glslang::EShClientOpenGL, ::glslang::EShTargetOpenGL_450);
            Shader.setEnvTarget(::glslang::EShTargetSpv, ::glslang::EShTargetSpv_1_0);
            shProfile = EProfile::EEsProfile;
            break;

        default:
            UNEXPECTED("Unknown SPIRV version");
    }
}